

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilEnum.c
# Opt level: O0

void Abc_EnumPrint_rec(Vec_Int_t *vGates,int i,int nVars)

{
  int iVar1;
  char *pcVar2;
  int t;
  char *pOper;
  int Fan1;
  int Fan0;
  int nVars_local;
  int i_local;
  Vec_Int_t *vGates_local;
  
  pOper._4_4_ = Vec_IntEntry(vGates,i << 1);
  iVar1 = Vec_IntEntry(vGates,i * 2 + 1);
  pcVar2 = "+";
  if (pOper._4_4_ < iVar1) {
    pcVar2 = "";
  }
  pOper._0_4_ = iVar1;
  if (iVar1 < pOper._4_4_) {
    pOper._0_4_ = pOper._4_4_;
    pOper._4_4_ = iVar1;
  }
  if (pOper._4_4_ < nVars) {
    printf("%c",(ulong)(pOper._4_4_ + 0x61));
  }
  else {
    printf("(");
    Abc_EnumPrint_rec(vGates,pOper._4_4_,nVars);
    printf(")");
  }
  printf("%s",pcVar2);
  if ((int)pOper < nVars) {
    printf("%c",(ulong)((int)pOper + 0x61));
  }
  else {
    printf("(");
    Abc_EnumPrint_rec(vGates,(int)pOper,nVars);
    printf(")");
  }
  return;
}

Assistant:

void Abc_EnumPrint_rec( Vec_Int_t * vGates, int i, int nVars )
{
    int Fan0 = Vec_IntEntry(vGates, 2*i);
    int Fan1 = Vec_IntEntry(vGates, 2*i+1);
    char * pOper = (char*)(Fan0 < Fan1 ? "" : "+");
    if ( Fan0 > Fan1 )
        ABC_SWAP( int, Fan0, Fan1 );
    if ( Fan0 < nVars )
        printf( "%c", 'a'+Fan0 );
    else
    {
        printf( "(" );
        Abc_EnumPrint_rec( vGates, Fan0, nVars );
        printf( ")" );
    }
    printf( "%s", pOper );
    if ( Fan1 < nVars )
        printf( "%c", 'a'+Fan1 );
    else
    {
        printf( "(" );
        Abc_EnumPrint_rec( vGates, Fan1, nVars );
        printf( ")" );
    }
}